

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O3

void Intp_ManFree(Intp_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  void *__ptr_00;
  int iVar1;
  long lVar2;
  
  __ptr = p->vAntClas;
  iVar1 = __ptr->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      __ptr_00 = __ptr->pArray[lVar2];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
        iVar1 = __ptr->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (p->pProofNums != (int *)0x0) {
    free(p->pProofNums);
    p->pProofNums = (int *)0x0;
  }
  if (p->pTrail != (lit *)0x0) {
    free(p->pTrail);
    p->pTrail = (lit *)0x0;
  }
  if (p->pAssigns != (lit *)0x0) {
    free(p->pAssigns);
    p->pAssigns = (lit *)0x0;
  }
  if (p->pSeens != (char *)0x0) {
    free(p->pSeens);
    p->pSeens = (char *)0x0;
  }
  if (p->pReasons != (Sto_Cls_t **)0x0) {
    free(p->pReasons);
    p->pReasons = (Sto_Cls_t **)0x0;
  }
  if (p->pWatches != (Sto_Cls_t **)0x0) {
    free(p->pWatches);
    p->pWatches = (Sto_Cls_t **)0x0;
  }
  if (p->pResLits != (lit *)0x0) {
    free(p->pResLits);
  }
  free(p);
  return;
}

Assistant:

void Intp_ManFree( Intp_Man_t * p )
{
/*
    printf( "Runtime stats:\n" );
ABC_PRT( "BCP     ", p->timeBcp   );
ABC_PRT( "Trace   ", p->timeTrace );
ABC_PRT( "TOTAL   ", p->timeTotal );
*/
//    Vec_IntFree( p->vAnties );
//    Vec_IntFree( p->vBreaks );
    Vec_VecFree( (Vec_Vec_t *)p->vAntClas );
//    ABC_FREE( p->pInters );
    ABC_FREE( p->pProofNums );
    ABC_FREE( p->pTrail );
    ABC_FREE( p->pAssigns );
    ABC_FREE( p->pSeens );
//    ABC_FREE( p->pVarTypes );
    ABC_FREE( p->pReasons );
    ABC_FREE( p->pWatches );
    ABC_FREE( p->pResLits );
    ABC_FREE( p );
}